

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

char * read_digit(Lexer *lexer,CharBuff *buff)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  
  bVar1 = false;
  do {
    uVar2 = read_chr(lexer);
    if (uVar2 == 0xc9) {
LAB_00102572:
      pcVar3 = to_string(buff);
      return pcVar3;
    }
    if (uVar2 - 0x3a < 0xfffffff6) {
      if ((uVar2 == 0x2e) && (!bVar1)) {
        uVar2 = read_chr(lexer);
        if (0xfffffff5 < uVar2 - 0x3a) {
          append_chr(buff,'.');
          bVar1 = true;
          goto LAB_00102560;
        }
      }
      lexer->last_chr = uVar2;
      goto LAB_00102572;
    }
LAB_00102560:
    append_chr(buff,(char)uVar2);
  } while( true );
}

Assistant:

char *read_digit(Lexer *lexer, CharBuff* buff) {
    uint chr;
    bool dot = false;
    while ((chr = read_chr(lexer)) != END) {
        if (is_digit(chr)) {
            append_chr(buff, (char) chr);
        } else if (chr == '.' && !dot) {
            dot = true;
            int pre_chr = chr;
            chr = read_chr(lexer);
            if (is_digit(chr)) {
                append_chr(buff, (char) pre_chr);
                append_chr(buff, (char) chr);
                dot = true;
            } else {
                unread_chr(lexer, chr);
                break;
            }
        } else {
            unread_chr(lexer, chr);
            break;
        }
    }
    return to_string(buff);
}